

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O1

void __thiscall
asmjit::v1_14::ZoneVector<unsigned_int>::release
          (ZoneVector<unsigned_int> *this,ZoneAllocator *allocator)

{
  uint *puVar1;
  int *piVar2;
  ZoneAllocator *pZVar3;
  byte bVar4;
  undefined8 *p;
  Error EVar5;
  undefined1 *puVar6;
  uint uVar7;
  undefined8 *in_RCX;
  uint *puVar8;
  long *plVar9;
  uint *puVar10;
  uint uVar11;
  undefined4 extraout_EDX;
  undefined8 *extraout_RDX;
  uint *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ZoneVector<unsigned_int> *unaff_RBX;
  uint uVar17;
  ulong unaff_RBP;
  ulong uVar18;
  uint *puVar19;
  long *plVar20;
  ZoneAllocator *allocator_00;
  uint *puVar21;
  ZoneAllocator *this_00;
  ZoneAllocator *pZVar22;
  undefined2 uVar23;
  uint *in_R8;
  uint *puVar24;
  ulong uVar25;
  long *plVar26;
  ZoneAllocator *pZVar27;
  int iVar28;
  long *plVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  char cVar33;
  long *plVar34;
  long *plVar35;
  ZoneVectorBase *this_01;
  bool bVar36;
  bool bVar37;
  char cVar38;
  ulong auStack_4c8 [2];
  ZoneVectorBase ZStack_4b8;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  uint *puStack_b0;
  ulong uStack_a8;
  size_t sStack_78;
  ZoneVectorBase *pZStack_70;
  undefined8 *puStack_58;
  code *pcStack_50;
  uint *puStack_48;
  code *pcStack_40;
  ZoneVector<unsigned_int> *pZStack_38;
  
  p = *(undefined8 **)this;
  if (p == (undefined8 *)0x0) {
    return;
  }
  if (*(long *)allocator == 0) {
    release();
  }
  else {
    uVar11 = *(int *)(this + 0xc) << 2;
    uVar30 = (ulong)uVar11;
    unaff_RBX = this;
    if (uVar30 != 0) {
      if (uVar11 < 0x201) {
        if (uVar11 < 0x81) {
          uVar7 = (uint)(uVar30 + 0x1fffffffff >> 5);
        }
        else {
          uVar7 = (int)(uVar30 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar7 = 0;
      }
      if (uVar11 < 0x201) {
        *p = *(undefined8 *)(allocator + (ulong)uVar7 * 8 + 8);
        *(undefined8 **)(allocator + (ulong)uVar7 * 8 + 8) = p;
      }
      else {
        ZoneAllocator::_releaseDynamic(allocator,p,uVar30);
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      return;
    }
  }
  release();
  if (allocator < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return;
  }
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  EVar5 = 0;
  pZStack_38 = unaff_RBX;
  if (((ZoneVectorBase *)this)->_capacity <
      (uint)(*(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1))) {
    pcStack_40 = (code *)0x12ade5;
    EVar5 = ZoneVectorBase::_growingReserve
                      ((ZoneVectorBase *)this,allocator,0xc,
                       *(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1));
  }
  if (EVar5 != 0) {
    return;
  }
  puVar8 = (uint *)((ZoneVectorBase *)this)->_data;
  puVar24 = (uint *)*extraout_RDX;
  puVar12 = (uint *)*in_RCX;
  puVar10 = puVar24 + (ulong)*(uint *)(extraout_RDX + 1) * 3;
  puVar19 = puVar12 + (ulong)*(uint *)(in_RCX + 1) * 3;
  puVar21 = puVar8;
  if ((ulong)*(uint *)(in_RCX + 1) != 0 && (ulong)*(uint *)(extraout_RDX + 1) != 0) {
    uVar11 = *puVar24;
    do {
      while (uVar7 = puVar12[1], uVar11 < uVar7) {
        uVar11 = *puVar12;
        while( true ) {
          uVar7 = puVar24[1];
          unaff_RBP = (ulong)uVar7;
          if (uVar11 < uVar7) break;
          puVar1 = puVar21 + 3;
          in_RCX = (undefined8 *)(ulong)*puVar24;
          *puVar21 = *puVar24;
          puVar21[1] = uVar7;
          unaff_RBP = (ulong)puVar24[2];
          puVar21[2] = puVar24[2];
          puVar24 = puVar24 + 3;
          puVar21 = puVar1;
          if (puVar24 == puVar10) {
            bVar36 = true;
            goto LAB_0012ad68;
          }
        }
        uVar11 = *puVar24;
        if (uVar11 < puVar12[1]) {
          bVar36 = false;
          goto LAB_0012ad68;
        }
      }
      unaff_RBP = (ulong)*puVar12;
      *puVar21 = *puVar12;
      puVar21[1] = uVar7;
      puVar21[2] = *in_R8;
      puVar21 = puVar21 + 3;
      puVar12 = puVar12 + 3;
    } while (puVar12 != puVar19);
    bVar36 = true;
LAB_0012ad68:
    if (!bVar36) {
      return;
    }
  }
  for (; puVar24 != puVar10; puVar24 = puVar24 + 3) {
    *(undefined8 *)puVar21 = *(undefined8 *)puVar24;
    puVar21[2] = puVar24[2];
    puVar21 = puVar21 + 3;
  }
  for (; puVar12 != puVar19; puVar12 = puVar12 + 3) {
    *(undefined8 *)puVar21 = *(undefined8 *)puVar12;
    puVar21[2] = *in_R8;
    puVar21 = puVar21 + 3;
  }
  if ((puVar21 < puVar8) || (puVar8 + (ulong)((ZoneVectorBase *)this)->_capacity * 3 < puVar21)) {
    pcStack_40 = (code *)0x12adef;
    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
    uVar11 = (uint)puVar8;
  }
  else {
    puVar21 = (uint *)((ulong)((long)puVar21 - (long)puVar8) >> 2);
    uVar11 = (int)puVar21 * -0x55555555;
    if (uVar11 <= ((ZoneVectorBase *)this)->_capacity) {
      ((ZoneVectorBase *)this)->_size = uVar11;
      return;
    }
  }
  uVar23 = SUB82(puVar24,0);
  pcStack_40 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
  pcStack_40 = (code *)(ulong)puVar21[2];
  if (puVar19 < pcStack_40) {
    return;
  }
  puStack_48 = (uint *)0x12ae0d;
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  puStack_48 = (uint *)(ulong)puVar21[2];
  if (puVar19 < puStack_48) {
    return;
  }
  pcStack_50 = RAStackAllocator::newSlot;
  ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
  pZStack_70 = (ZoneVectorBase *)this;
  puStack_58 = in_RCX;
  pcStack_50 = (code *)unaff_RBP;
  if ((puVar21[9] != puVar21[8]) ||
     (EVar5 = ZoneVectorBase::_grow((ZoneVectorBase *)(puVar21 + 6),*(ZoneAllocator **)puVar21,8,1),
     EVar5 == 0)) {
    this_00 = *(ZoneAllocator **)puVar21;
    if (*(long *)this_00 == 0) {
      RAStackAllocator::newSlot();
LAB_0012aedb:
      RAStackAllocator::newSlot();
      uStack_a8 = (ulong)puVar19 & 0xffffffff;
      puStack_b0 = puVar21;
      plVar9 = *(long **)(this_00 + 0x18);
      uVar30 = (ulong)*(uint *)(this_00 + 0x20);
      if (uVar30 != 0) {
        plVar20 = (long *)0x0;
        do {
          lVar13 = *(long *)((long)plVar9 + (long)plVar20);
          bVar4 = *(byte *)(lVar13 + 1);
          if (bVar4 == 0) goto LAB_0012b353;
          uVar11 = 0;
          if (bVar4 != 0) {
            for (; (bVar4 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          uVar7 = 6;
          if ((char)uVar11 != '\a') {
            uVar7 = uVar11;
          }
          if ((*(byte *)(lVar13 + 2) & 1) == 0) {
            uVar25 = (ulong)(uVar7 & 0xff);
          }
          else {
            uVar25 = (ulong)(byte)((byte)uVar7 ^ 7) * (ulong)*(uint *)(lVar13 + 8) + 0x10;
          }
          if (0xfffffffe < uVar25) {
            uVar25 = 0xffffffff;
          }
          *(int *)(lVar13 + 0xc) = (int)uVar25;
          plVar20 = plVar20 + 1;
        } while (uVar30 * 8 - (long)plVar20 != 0);
      }
      plVar20 = plVar9 + uVar30;
      lVar13 = 0;
LAB_0012af74:
      uVar25 = (long)plVar20 - (long)plVar9 >> 3;
      if (7 < uVar25) {
        plVar35 = plVar9 + 1;
        plVar26 = plVar20 + -1;
        lVar14 = *(long *)((long)plVar9 + (uVar25 & 0xfffffffffffffffe) * 4);
        *(long *)((long)plVar9 + (uVar25 & 0xfffffffffffffffe) * 4) = *plVar9;
        *plVar9 = lVar14;
        lVar14 = plVar9[1];
        if (*(uint *)(plVar20[-1] + 0xc) < *(uint *)(lVar14 + 0xc)) {
          *plVar35 = plVar20[-1];
          *plVar26 = lVar14;
        }
        lVar14 = *plVar9;
        if (*(uint *)(*plVar26 + 0xc) < *(uint *)(lVar14 + 0xc)) {
          *plVar9 = *plVar26;
          *plVar26 = lVar14;
        }
        lVar14 = plVar9[1];
        if (*(uint *)(*plVar9 + 0xc) < *(uint *)(lVar14 + 0xc)) {
          plVar9[1] = *plVar9;
          *plVar9 = lVar14;
        }
LAB_0012aff6:
        if (plVar35 < plVar26) goto code_r0x0012affb;
        goto LAB_0012b010;
      }
      if ((plVar9 != plVar20) && (1 < (long)uVar25)) {
        plVar35 = plVar9 + 1;
        plVar26 = plVar35;
joined_r0x0012b098:
        do {
          if (plVar9 < plVar35) {
            lVar14 = plVar35[-1];
            if (*(uint *)(*plVar35 + 0xc) < *(uint *)(lVar14 + 0xc)) {
              plVar35[-1] = *plVar35;
              *plVar35 = lVar14;
              plVar35 = plVar35 + -1;
              goto joined_r0x0012b098;
            }
          }
          plVar35 = plVar26 + 1;
          plVar26 = plVar35;
        } while (plVar35 < (long *)(((long)plVar20 - (long)plVar9) + (long)plVar9));
      }
      if (lVar13 != 0) {
        plVar9 = *(long **)((long)auStack_4c8 + lVar13);
        plVar20 = *(long **)((long)auStack_4c8 + lVar13 + 8);
        lVar13 = lVar13 + -0x10;
        goto LAB_0012af74;
      }
      uStack_468 = 0;
      uStack_460 = 0;
      uStack_478 = 0;
      uStack_470 = 0;
      uStack_488 = 0;
      uStack_480 = 0;
      uStack_498 = 0;
      uStack_490 = 0;
      uStack_4a8 = 0;
      uStack_4a0 = 0;
      ZStack_4b8._data = (void *)0x0;
      ZStack_4b8._size = 0;
      ZStack_4b8._capacity = 0;
      bVar36 = uVar30 == 0;
      if (bVar36) {
        iVar28 = -1;
      }
      else {
        pZVar27 = *(ZoneAllocator **)(this_00 + 0x18);
        pZVar3 = pZVar27 + uVar30 * 8;
        uVar30 = 0;
        do {
          lVar13 = *(long *)pZVar27;
          cVar33 = '\a';
          if ((*(byte *)(lVar13 + 2) & 2) == 0) {
            bVar4 = *(byte *)(lVar13 + 1);
            uVar11 = *(uint *)(lVar13 + 4);
            allocator_00 = (ZoneAllocator *)(ulong)uVar11;
            iVar28 = 0;
            if (uVar11 < 0x40) {
              uVar7 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              puVar10 = (uint *)((long)&ZStack_4b8._size + (ulong)(uVar7 << 4));
              lVar14 = 0;
              if ((ulong)uVar7 < 6) {
                lVar14 = 5 - (ulong)uVar7;
              }
              lVar14 = lVar14 + 1;
              do {
                bVar37 = *puVar10 != 0;
                if (bVar37) {
                  uVar7 = *puVar10 - 1;
                  pZVar22 = (ZoneAllocator *)(ulong)uVar7;
                  *puVar10 = uVar7;
                  uVar7 = *(uint *)(*(long *)(puVar10 + -2) + (long)pZVar22 * 8);
                  if (uVar7 % (uint)bVar4 != 0) goto LAB_0012b35d;
                  iVar28 = *(int *)(*(long *)(puVar10 + -2) + 4 + (long)pZVar22 * 8);
                  *(uint *)(lVar13 + 0x10) = uVar7;
                  iVar28 = iVar28 - uVar11;
                  uVar25 = (ulong)(uVar7 - uVar11);
                  goto LAB_0012b1c7;
                }
                puVar10 = puVar10 + 4;
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
              uVar25 = 0;
            }
            else {
              bVar37 = false;
              uVar25 = 0;
            }
LAB_0012b1c7:
            auStack_4c8[1] = (ulong)bVar4;
            uVar7 = -(uint)bVar4 & ((int)uVar30 + (uint)bVar4) - 1;
            iVar15 = uVar7 - (int)uVar30;
            iVar16 = iVar15;
            if (iVar15 == 0 || bVar37) {
              iVar16 = iVar28;
            }
            uVar30 = uVar30 & 0xffffffff;
            if (!bVar37) {
              uVar30 = (ulong)uVar7;
            }
            if (iVar16 != 0) {
              uVar18 = (ulong)uVar7;
              if (iVar15 == 0 || bVar37) {
                uVar18 = uVar25;
              }
              uVar7 = iVar16 + (int)uVar18;
              do {
                uVar11 = (uint)allocator_00;
                uVar17 = (uint)uVar18;
                cVar33 = '\0';
                if (uVar7 <= uVar17) goto LAB_0012b2cf;
                iVar28 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                  }
                }
                uVar11 = 1 << ((byte)iVar28 & 0x1f);
                cVar38 = '\r';
                if (uVar11 <= uVar7 - uVar17) {
                  uVar25 = (ulong)(uint)(iVar28 << 4);
                  this_01 = (ZoneVectorBase *)((long)&ZStack_4b8._data + uVar25);
                  if (*(int *)((long)&ZStack_4b8._size + uVar25) ==
                      *(int *)((long)&ZStack_4b8._capacity + uVar25)) {
                    allocator_00 = *(ZoneAllocator **)this_00;
                    auStack_4c8[0] = uVar30;
                    EVar5 = ZoneVectorBase::_grow(this_01,allocator_00,8,1);
                    uVar30 = auStack_4c8[0];
                    if (EVar5 == 0) goto LAB_0012b235;
                  }
                  else {
LAB_0012b235:
                    allocator_00 = (ZoneAllocator *)(uVar18 | (ulong)uVar11 << 0x20);
                    *(ZoneAllocator **)
                     ((long)this_01->_data + (ulong)*(uint *)((long)&ZStack_4b8._size + uVar25) * 8)
                         = allocator_00;
                    piVar2 = (int *)((long)&ZStack_4b8._size + uVar25);
                    *piVar2 = *piVar2 + 1;
                    EVar5 = 0;
                  }
                  cVar38 = EVar5 != 0;
                  if ((bool)cVar38) {
                    uVar11 = 0;
                  }
                  uVar18 = (ulong)(uVar11 + uVar17);
                }
                uVar11 = (uint)allocator_00;
              } while (cVar38 == '\0');
              cVar33 = '\0';
              if (cVar38 != '\r') {
                cVar33 = cVar38;
              }
LAB_0012b2cf:
              if (cVar33 != '\0') goto LAB_0012b2f6;
            }
            cVar33 = '\0';
            if (!bVar37) {
              pZVar22 = pZVar3;
              if ((int)((uVar30 & 0xffffffff) % (auStack_4c8[1] & 0xffffffff)) != 0)
              goto LAB_0012b358;
              *(int *)(lVar13 + 0x10) = (int)uVar30;
              uVar30 = (ulong)(uint)((int)uVar30 + *(int *)(lVar13 + 4));
            }
          }
LAB_0012b2f6:
          if ((cVar33 != '\a') && (cVar33 != '\0')) break;
          pZVar27 = pZVar27 + 8;
          bVar36 = pZVar27 == pZVar3;
        } while (!bVar36);
        iVar28 = (int)uVar30 + -1;
      }
      if (bVar36) {
        *(int *)(this_00 + 0xc) = -*(int *)(this_00 + 0x10) & iVar28 + *(int *)(this_00 + 0x10);
      }
      return;
    }
    puVar6 = (undefined1 *)ZoneAllocator::_alloc(this_00,0x14,&sStack_78);
    if (puVar6 != (undefined1 *)0x0) {
      *puVar6 = (char)((ulong)puVar19 & 0xffffffff);
      puVar6[1] = (char)uVar11 + (uVar11 == 0);
      *(undefined2 *)(puVar6 + 2) = uVar23;
      *(undefined4 *)(puVar6 + 8) = 0;
      *(undefined4 *)(puVar6 + 4) = extraout_EDX;
      *(undefined8 *)(puVar6 + 0xc) = 0;
      if (uVar11 < puVar21[4]) {
        uVar11 = puVar21[4];
      }
      puVar21[4] = uVar11;
      if (puVar21[9] <= puVar21[8]) goto LAB_0012aedb;
      *(undefined1 **)(*(long *)(puVar21 + 6) + (ulong)puVar21[8] * 8) = puVar6;
      puVar21[8] = puVar21[8] + 1;
    }
  }
  return;
code_r0x0012affb:
  plVar34 = plVar35 + 1;
  plVar35 = plVar35 + 1;
  if (*(uint *)(*plVar34 + 0xc) < *(uint *)(*plVar9 + 0xc)) goto LAB_0012aff6;
LAB_0012b010:
  do {
    if (plVar26 <= plVar9) break;
    plVar34 = plVar26 + -1;
    plVar26 = plVar26 + -1;
  } while (*(uint *)(*plVar9 + 0xc) < *(uint *)(*plVar34 + 0xc));
  if (plVar35 <= plVar26) {
    lVar14 = *plVar35;
    *plVar35 = *plVar26;
    *plVar26 = lVar14;
    goto LAB_0012aff6;
  }
  lVar14 = *plVar9;
  lVar31 = (long)plVar26 - (long)plVar9;
  lVar32 = (long)plVar20 - (long)plVar35;
  plVar34 = plVar35;
  if (lVar32 < lVar31) {
    plVar34 = plVar9;
  }
  *plVar9 = *plVar26;
  plVar29 = plVar20;
  if (lVar32 < lVar31) {
    plVar29 = plVar26;
  }
  *plVar26 = lVar14;
  *(long **)((long)&ZStack_4b8._data + lVar13) = plVar34;
  *(long **)((long)&ZStack_4b8._size + lVar13) = plVar29;
  if (lVar13 < 0x3f1) {
    if (lVar32 < lVar31) {
      plVar9 = plVar35;
      plVar26 = plVar20;
    }
    plVar20 = plVar26;
    lVar13 = lVar13 + 0x10;
    goto LAB_0012af74;
  }
  RAStackAllocator::calculateStackFrame();
LAB_0012b353:
  uVar11 = (uint)plVar20;
  RAStackAllocator::calculateStackFrame();
  pZVar22 = this_00;
LAB_0012b358:
  RAStackAllocator::calculateStackFrame();
LAB_0012b35d:
  RAStackAllocator::calculateStackFrame();
  uVar7 = *(uint *)(pZVar22 + 0x20);
  if ((ulong)uVar7 != 0) {
    lVar13 = *(long *)(pZVar22 + 0x18);
    lVar14 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar13 + lVar14) + 2) & 2) == 0) {
        piVar2 = (int *)(*(long *)(lVar13 + lVar14) + 0x10);
        *piVar2 = *piVar2 + uVar11;
      }
      lVar14 = lVar14 + 8;
    } while ((ulong)uVar7 << 3 != lVar14);
  }
  return;
}

Assistant:

inline void _release(ZoneAllocator* allocator, uint32_t sizeOfT) noexcept {
    if (_data != nullptr) {
      allocator->release(_data, _capacity * sizeOfT);
      reset();
    }
  }